

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O0

bool __thiscall de::FilePath::exists(FilePath *this)

{
  int iVar1;
  char *__file;
  undefined1 local_c0 [4];
  int result;
  stat st;
  FilePath normPath;
  FilePath *this_local;
  
  normalize((FilePath *)(st.__glibc_reserved + 2),this);
  __file = getPath((FilePath *)(st.__glibc_reserved + 2));
  iVar1 = stat(__file,(stat *)local_c0);
  ~FilePath((FilePath *)(st.__glibc_reserved + 2));
  return iVar1 == 0;
}

Assistant:

bool FilePath::exists (void) const
{
	FilePath	normPath	= FilePath::normalize(*this);
	struct		stat		st;
	int			result		= stat(normPath.getPath(), &st);
	return result == 0;
}